

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,3>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  bool *pbVar1;
  undefined8 *puVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar7;
  pointer pcVar8;
  double dVar9;
  PrecisionCase *pPVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar11;
  undefined8 uVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  _Rb_tree_node_base *p_Var16;
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  Interval *pIVar20;
  IVal *value;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  Vector<float,_3> *ival;
  undefined1 *puVar22;
  Matrix<float,_3,_3> *val;
  long lVar23;
  long lVar24;
  size_t size;
  ulong uVar25;
  IVal reference1;
  IVal in2;
  IVal in3;
  Environment env;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined1 auStack_598 [8];
  PrecisionCase *local_590;
  IVal local_581;
  string local_580;
  pointer local_560;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_558;
  Statement *local_550;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_548;
  size_t local_540;
  string local_538;
  ulong local_518;
  ResultCollector *local_510;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_508;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  double local_4b8;
  Data local_4b0;
  undefined4 local_4a0;
  ios_base local_468 [8];
  ios_base local_460 [264];
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_358;
  FloatFormat local_328;
  undefined1 local_2f8 [56];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  _Rb_tree_node_base *local_260;
  double local_258;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = ((long)pMVar6 - (long)pMVar5 >> 2) * -0x71c71c71c71c71c7;
  local_558 = variables;
  local_550 = stmt;
  local_548 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_3>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_358,size);
  local_2c0._M_p = (pointer)&local_2b0;
  local_2f8._0_4_ = GLSL_VERSION_300_ES;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = (pointer)0x0;
  local_2f8._24_8_ = (pointer)0x0;
  local_2f8._32_8_ = (pointer)0x0;
  local_2f8._40_8_ = (pointer)0x0;
  local_2f8._48_8_ = (pointer)0x0;
  local_2b8 = 0;
  local_2b0._M_local_buf[0] = '\0';
  local_2a0._M_p = (pointer)&local_290;
  local_298 = 0;
  local_290._M_local_buf[0] = '\0';
  local_328.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_328.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_328.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_328.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_328.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_328.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_328.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_328.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_328._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_508._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_508._M_impl.super__Rb_tree_header._M_header;
  local_508._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_508._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_508._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4d8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_4d8 + 8);
  local_508._M_impl.super__Rb_tree_header._M_header._M_right =
       local_508._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_550->_vptr_Statement[2])(local_550,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_590 = this;
  local_560 = pMVar5;
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_460);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_280 + 8);
  local_280._8_4_ = _S_red;
  local_270._0_8_ = (_Base_ptr)0x0;
  local_258 = 0.0;
  local_270._8_8_ = p_Var4;
  local_260 = p_Var4;
  (*local_550->_vptr_Statement[4])(local_550,local_280);
  if ((_Rb_tree_node_base *)local_270._8_8_ != p_Var4) {
    p_Var16 = (_Rb_tree_node_base *)local_270._8_8_;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var4);
  }
  pPVar10 = local_590;
  if (local_258 != 0.0) {
    local_4d8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,local_580._M_dataplus._M_p,local_580._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_580._M_dataplus._M_p != &local_580.field_2) {
      operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_460);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"precision ",10);
  __s = glu::getPrecisionName((pPVar10->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_598 + *(long *)(local_4d8._0_8_ + -0x18)) + 0xc0);
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base(local_468);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_590->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_2f8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_590->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_590->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar21) {
      local_4c8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_4c8._8_8_ = plVar18[3];
      local_4d8._0_8_ = &local_4c8;
    }
    else {
      local_4c8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_4d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_4d8._8_8_ = plVar18[1];
    *plVar18 = (long)paVar21;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2c0,(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,local_4c8._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2f8 + 8),1);
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)local_4d8,local_590,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr);
  uVar12 = local_2f8._8_8_;
  std::__cxx11::string::operator=((string *)local_2f8._8_8_,(string *)local_4d8);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_4b8);
  glu::VarType::~VarType((VarType *)&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,local_4c8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2f8 + 0x20),1);
  makeSymbol<tcu::Matrix<float,3,3>>
            ((Symbol *)local_4d8,local_590,
             (local_558->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr);
  uVar12 = local_2f8._32_8_;
  std::__cxx11::string::operator=((string *)local_2f8._32_8_,(string *)local_4d8);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_4b8);
  glu::VarType::~VarType((VarType *)&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,local_4c8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  (*local_550->_vptr_Statement[2])(local_550,local_4d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base(local_468);
  std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar10 = local_590;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_590->m_ctx).renderContext,(local_590->m_ctx).shaderType,
                       (ShaderSpec *)local_2f8);
  local_4d8._0_8_ =
       (local_548->in0).
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4d8._8_8_ =
       (local_548->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4c8._M_allocated_capacity =
       (size_type)
       (local_548->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4c8._8_8_ =
       (local_548->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_358.out0.
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_358.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  ival = (Vector<float,_3> *)local_1a8;
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,size & 0xffffffff,local_4d8);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_4d8);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
  pVVar11 = local_558;
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_508,
             (local_558->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_508,
             (pVVar11->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_280);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_508,
             (pVVar11->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_580);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_508,
             (pVVar11->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_538);
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_508,
             (pVVar11->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_508,
             (pVVar11->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_581);
  pPVar10 = local_590;
  if (pMVar6 == local_560) {
LAB_0078661b:
    local_4d8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(local_590->m_ctx).floatFormat;
    local_510 = &local_590->m_status;
    poVar3 = (ostringstream *)(local_4d8 + 8);
    local_518 = size + (size == 0);
    uVar25 = 0;
    local_560 = (pointer)0x0;
    local_540 = size;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      if ((uVar25 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_590->super_TestCase).super_TestNode.m_testCtx);
      }
      round<tcu::Matrix<float,3,3>>
                ((IVal *)local_280,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_548->in0).
                  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25),(Matrix<float,_3,_3> *)ival);
      pVVar11 = local_558;
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)local_4d8,fmt,(IVal *)local_280);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_508,
                           (pVVar11->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      puVar22 = local_4d8;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar24) = *(undefined8 *)(puVar22 + lVar24 + 0x10);
          dVar9 = *(double *)((long)(puVar22 + lVar24) + 8);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          *(undefined8 *)pbVar1 = *(undefined8 *)(puVar22 + lVar24);
          *(double *)(pbVar1 + 8) = dVar9;
          lVar24 = lVar24 + 0x48;
        } while (lVar24 != 0xd8);
        lVar23 = lVar23 + 1;
        pIVar20 = pIVar20 + 1;
        puVar22 = puVar22 + 0x18;
      } while (lVar23 != 3);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_508,
                 (pVVar11->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_508,
                 (pVVar11->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_508,
                 (pVVar11->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_4b0.basic.type = (local_590->m_ctx).precision;
      local_4b8 = (pPVar10->m_ctx).floatFormat.m_maxValue;
      local_4d8._0_8_ = *(undefined8 *)fmt;
      local_4d8._8_8_ = *(undefined8 *)&(pPVar10->m_ctx).floatFormat.m_fractionBits;
      local_4c8._M_allocated_capacity = *(undefined8 *)&(pPVar10->m_ctx).floatFormat.m_hasInf;
      local_4c8._8_8_ = *(undefined8 *)&(pPVar10->m_ctx).floatFormat.m_exactPrecision;
      local_4a0 = 0;
      local_4b0._8_8_ = &local_508;
      (*local_550->_vptr_Statement[3])(local_550,local_4d8);
      value = Environment::lookup<tcu::Matrix<float,3,3>>
                        ((Environment *)&local_508,
                         (pVVar11->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                         .m_ptr);
      pIVar20 = (Interval *)local_4d8;
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)pIVar20,&local_328,value);
      ival = (Vector<float,_3> *)local_1a8;
      lVar23 = 0;
      do {
        lVar24 = 0;
        do {
          *(undefined8 *)((long)ival[1].m_data + lVar24 + 4) =
               *(undefined8 *)((long)&pIVar20->m_hi + lVar24);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar24;
          dVar9 = *(double *)(pbVar1 + 8);
          puVar2 = (undefined8 *)
                   ((long)((Vector<tcu::Vector<float,_3>,_3> *)ival->m_data)->m_data[0].m_data +
                   lVar24);
          *puVar2 = *(undefined8 *)pbVar1;
          puVar2[1] = dVar9;
          lVar24 = lVar24 + 0x48;
        } while (lVar24 != 0xd8);
        lVar23 = lVar23 + 1;
        ival = ival + 2;
        pIVar20 = pIVar20 + 1;
      } while (lVar23 != 3);
      bVar13 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_358.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar25);
      local_4d8._0_8_ = &local_4c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4d8,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_510,bVar13,(string *)local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,(ulong)(local_4c8._M_allocated_capacity + 1));
      }
      pVVar11 = local_558;
      if (!bVar13) {
        uVar15 = (int)local_560 + 1;
        local_560 = (pointer)(ulong)uVar15;
        if ((int)uVar15 < 0x65) {
          local_4d8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar7 = (pVVar11->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                   .m_ptr;
          val = (Matrix<float,_3,_3> *)local_270;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_280._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_280,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_280._0_8_,
                     CONCAT44(local_280._12_4_,local_280._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,3,3>>
                    (&local_580,(BuiltinPrecisionTests *)&local_328,
                     (FloatFormat *)
                     ((local_548->in0).
                      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar25),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_580._M_dataplus._M_p,local_580._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_580._M_dataplus._M_p != &local_580.field_2) {
            operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_3,_3> *)local_280._0_8_ != (Matrix<float,_3,_3> *)local_270) {
            operator_delete((void *)local_280._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_270._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar7 = (pVVar11->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_3>_>_>
                   .m_ptr;
          ival = (Vector<float,_3> *)local_270;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_280._0_8_ = ival;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_280,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_280._0_8_,
                     CONCAT44(local_280._12_4_,local_280._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,3,3>>
                    (&local_580,(BuiltinPrecisionTests *)&local_328,
                     (FloatFormat *)
                     (local_358.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar25),
                     (Matrix<float,_3,_3> *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_580._M_dataplus._M_p,local_580._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,3>>
                    (&local_538,(BuiltinPrecisionTests *)&local_328,(FloatFormat *)local_1a8,
                     (IVal *)ival);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_538._M_dataplus._M_p,local_538._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p != &local_538.field_2) {
            operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_580._M_dataplus._M_p != &local_580.field_2) {
            operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_280._0_8_ != local_270) {
            operator_delete((void *)local_280._0_8_,
                            (ulong)((long)(_Rb_tree_color *)local_270._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_460);
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_518);
    iVar14 = (int)local_560;
    if (iVar14 < 0x65) {
      if (iVar14 == 0) goto LAB_0078661b;
    }
    else {
      local_4d8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar3 = (ostringstream *)(local_4d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_460);
    }
    local_4d8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4d8 + 8));
  std::ios_base::~ios_base(local_460);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_508);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p,
                    CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_p != &local_2b0) {
    operator_delete(local_2c0._M_p,
                    CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2f8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2f8 + 8));
  if (local_358.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}